

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_helper_out_func(TCGContext *tcg_ctx,MemOp ot,TCGv_i32 v,TCGv_i32 n)

{
  code *func;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  TCGv_i32 local_8;
  
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = v + (long)tcg_ctx;
  local_8 = n + (long)tcg_ctx;
  if (ot == MO_32) {
    func = helper_outl_x86_64;
  }
  else if (ot == MO_16) {
    func = helper_outw_x86_64;
  }
  else {
    func = helper_outb_x86_64;
  }
  tcg_gen_callN_x86_64(tcg_ctx,func,(TCGTemp *)0x0,3,&local_18);
  return;
}

Assistant:

static void gen_helper_out_func(TCGContext *tcg_ctx, MemOp ot, TCGv_i32 v, TCGv_i32 n)
{
    switch (ot) {
    case MO_8:
        gen_helper_outb(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    case MO_16:
        gen_helper_outw(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    case MO_32:
        gen_helper_outl(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    default:
        tcg_abort();
    }
}